

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::JoinHashTable::Hash
          (JoinHashTable *this,DataChunk *keys,SelectionVector *sel,idx_t count,Vector *hashes)

{
  idx_t iVar1;
  reference pvVar2;
  idx_t i_1;
  idx_t i;
  ulong uVar3;
  
  iVar1 = keys->count;
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&keys->data,0);
  if (iVar1 == count) {
    VectorOperations::Hash(pvVar2,hashes,keys->count);
    for (uVar3 = 1;
        uVar3 < (ulong)(((long)(this->equality_types).
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               .
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->equality_types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1)
    {
      pvVar2 = vector<duckdb::Vector,_true>::get<true>(&keys->data,uVar3);
      VectorOperations::CombineHash(hashes,pvVar2,keys->count);
    }
  }
  else {
    VectorOperations::Hash(pvVar2,hashes,sel,count);
    for (uVar3 = 1;
        uVar3 < (ulong)(((long)(this->equality_types).
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               .
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->equality_types).
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              .
                              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1)
    {
      pvVar2 = vector<duckdb::Vector,_true>::get<true>(&keys->data,uVar3);
      VectorOperations::CombineHash(hashes,pvVar2,sel,count);
    }
  }
  return;
}

Assistant:

void JoinHashTable::Hash(DataChunk &keys, const SelectionVector &sel, idx_t count, Vector &hashes) {
	if (count == keys.size()) {
		// no null values are filtered: use regular hash functions
		VectorOperations::Hash(keys.data[0], hashes, keys.size());
		for (idx_t i = 1; i < equality_types.size(); i++) {
			VectorOperations::CombineHash(hashes, keys.data[i], keys.size());
		}
	} else {
		// null values were filtered: use selection vector
		VectorOperations::Hash(keys.data[0], hashes, sel, count);
		for (idx_t i = 1; i < equality_types.size(); i++) {
			VectorOperations::CombineHash(hashes, keys.data[i], sel, count);
		}
	}
}